

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# switch.cpp
# Opt level: O0

void __thiscall QtMWidgets::Switch::Switch(Switch *this,QWidget *parent)

{
  SwitchPrivate *this_00;
  QSizePolicy local_30 [5];
  QFlags<Qt::WindowType> local_1c;
  QWidget *local_18;
  QWidget *parent_local;
  Switch *this_local;
  
  local_18 = parent;
  parent_local = &this->super_QWidget;
  QFlags<Qt::WindowType>::QFlags(&local_1c);
  QWidget::QWidget(&this->super_QWidget,parent,(QFlags_conflict1 *)(ulong)local_1c.i);
  *(undefined ***)this = &PTR_metaObject_00242170;
  *(undefined ***)&this->field_0x10 = &PTR__Switch_00242320;
  this_00 = (SwitchPrivate *)operator_new(0x70);
  SwitchPrivate::SwitchPrivate(this_00,this);
  QScopedPointer<QtMWidgets::SwitchPrivate,_QScopedPointerDeleter<QtMWidgets::SwitchPrivate>_>::
  QScopedPointer(&this->d,this_00);
  QSizePolicy::QSizePolicy(local_30,Fixed,Fixed,DefaultType);
  QWidget::setSizePolicy((QSizePolicy *)this);
  return;
}

Assistant:

Switch::Switch( QWidget * parent )
	:	QWidget( parent )
	,	d( new SwitchPrivate( this ) )
{
	setSizePolicy( QSizePolicy( QSizePolicy::Fixed, QSizePolicy::Fixed ) );
}